

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

uchar * write_bn(uchar *buf,BIGNUM *bn,int bn_bytes)

{
  uchar *__dest;
  uchar *p;
  int bn_bytes_local;
  BIGNUM *bn_local;
  uchar *buf_local;
  
  __dest = buf + 4;
  *__dest = '\0';
  BN_bn2bin((BIGNUM *)bn,buf + 5);
  p._4_4_ = bn_bytes;
  if ((buf[5] & 0x80) == 0) {
    p._4_4_ = bn_bytes - 1;
    memmove(__dest,buf + 5,(long)(int)p._4_4_);
  }
  _libssh2_htonu32(buf,p._4_4_);
  return __dest + (int)p._4_4_;
}

Assistant:

static unsigned char *
write_bn(unsigned char *buf, const BIGNUM *bn, int bn_bytes)
{
    unsigned char *p = buf;

    /* Left space for bn size which will be written below. */
    p += 4;

    *p = 0;
    BN_bn2bin(bn, p + 1);
    if(!(*(p + 1) & 0x80)) {
        memmove(p, p + 1, --bn_bytes);
    }
    _libssh2_htonu32(p - 4, bn_bytes);  /* Post write bn size. */

    return p + bn_bytes;
}